

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_mtree.c
# Opt level: O1

void test_write_format_mtree_sub(int dironly)

{
  uint uVar1;
  uint uVar2;
  wchar_t wVar3;
  int iVar4;
  uint uVar5;
  mode_t mVar6;
  archive *paVar7;
  char *pcVar8;
  time_t v2;
  la_int64_t lVar9;
  time_t tVar10;
  char *e1;
  longlong lVar11;
  ulong uVar12;
  la_ssize_t v2_00;
  char *pcVar13;
  long lVar14;
  archive_entry *ae;
  size_t used;
  archive_entry *local_58;
  int local_4c;
  archive *local_48;
  archive *local_40;
  size_t local_38;
  
  paVar7 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                   ,L'v',(uint)(paVar7 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  wVar3 = archive_write_set_format_mtree_classic(paVar7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                      ,L'w',0,"ARCHIVE_OK",(long)wVar3,"archive_write_set_format_mtree_classic(a)",
                      paVar7);
  iVar4 = archive_write_set_format_option(paVar7,(char *)0x0,"indent","1");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                      ,L'y',0,"ARCHIVE_OK",(long)iVar4,
                      "archive_write_set_format_option(a, NULL, \"indent\", \"1\")",paVar7);
  local_4c = dironly;
  if (dironly != 0) {
    iVar4 = archive_write_set_format_option(paVar7,(char *)0x0,"dironly","1");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                        ,L'|',0,"ARCHIVE_OK",(long)iVar4,
                        "archive_write_set_format_option(a, NULL, \"dironly\", \"1\")",paVar7);
  }
  iVar4 = archive_write_open_memory(paVar7,buff,0xfff,&local_38);
  local_40 = paVar7;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                      ,L'~',0,"ARCHIVE_OK",(long)iVar4,
                      "archive_write_open_memory(a, buff, sizeof(buff)-1, &used)",paVar7);
  pcVar8 = ".";
  lVar14 = 0x20;
  do {
    local_48 = (archive *)pcVar8;
    local_58 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                     ,L'\x82',(uint)(local_58 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    uVar1 = *(uint *)((long)&entries[0xc].mode + lVar14);
    uVar2 = *(uint *)((long)&entries[0xc].nlink + lVar14);
    archive_entry_set_nlink(local_58,uVar2);
    uVar5 = archive_entry_nlink(local_58);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                        ,L'\x84',(long)(int)uVar2,"entries[i].nlink",(ulong)uVar5,
                        "archive_entry_nlink(ae)",(void *)0x0);
    tVar10 = *(time_t *)((long)&entries[0xc].mtime + lVar14);
    archive_entry_set_mtime(local_58,tVar10,0);
    v2 = archive_entry_mtime(local_58);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                        ,L'\x86',tVar10,"entries[i].mtime",v2,"archive_entry_mtime(ae)",(void *)0x0)
    ;
    archive_entry_set_mode(local_58,uVar1);
    mVar6 = archive_entry_mode(local_58);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                        ,L'\x88',(ulong)uVar1,"entries[i].mode",(ulong)mVar6,
                        "archive_entry_mode(ae)",(void *)0x0);
    uVar12 = (ulong)*(uint *)((long)&entries[0xc].uid + lVar14);
    archive_entry_set_uid(local_58,uVar12);
    lVar9 = archive_entry_uid(local_58);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                        ,L'\x8a',uVar12,"entries[i].uid",lVar9,"archive_entry_uid(ae)",(void *)0x0);
    uVar12 = (ulong)*(uint *)((long)&entries[0xc].gid + lVar14);
    archive_entry_set_gid(local_58,uVar12);
    lVar9 = archive_entry_gid(local_58);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                        ,L'\x8c',uVar12,"entries[i].gid",lVar9,"archive_entry_gid(ae)",(void *)0x0);
    archive_entry_copy_pathname(local_58,(char *)local_48);
    paVar7 = local_40;
    if ((uVar1 & 0xf000) == 0x4000) {
      iVar4 = archive_write_header(local_40,local_58);
      v2_00 = (la_ssize_t)iVar4;
      wVar3 = L'\x90';
      lVar11 = 0;
      pcVar8 = "ARCHIVE_OK";
      pcVar13 = "archive_write_header(a, ae)";
    }
    else {
      archive_entry_set_size(local_58,8);
      paVar7 = local_40;
      iVar4 = archive_write_header(local_40,local_58);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                          ,L'\x90',0,"ARCHIVE_OK",(long)iVar4,"archive_write_header(a, ae)",paVar7);
      v2_00 = archive_write_data(paVar7,"Hello012",0xf);
      lVar11 = 8;
      wVar3 = L'\x93';
      pcVar8 = "8";
      pcVar13 = "archive_write_data(a, \"Hello012\", 15)";
    }
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                        ,wVar3,lVar11,pcVar8,v2_00,pcVar13,paVar7);
    archive_entry_free(local_58);
    paVar7 = local_40;
    pcVar8 = *(char **)((long)&entries[0].path + lVar14);
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0x1a0);
  iVar4 = archive_write_close(local_40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                      ,L'\x96',0,"ARCHIVE_OK",(long)iVar4,"archive_write_close(a)",paVar7);
  iVar4 = archive_write_free(paVar7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                      ,L'\x97',0,"ARCHIVE_OK",(long)iVar4,"archive_write_free(a)",(void *)0x0);
  buff[local_38] = '\0';
  if (local_4c == 0) {
    pcVar8 = 
    "#mtree\n\n# .\n/set type=file uid=1001 gid=1001 mode=644\n.               time=1231975636.0 mode=755 type=dir\n    COPYING         time=1231975636.0 size=8\n    Makefile        time=1233041050.0 size=8\n    NEWS            time=1231975636.0 size=8\n    PROJECTS        time=1231975636.0 size=8\n    README          time=1231975636.0 size=8\n\n# ./subdir\n/set mode=664\n    subdir          time=1233504586.0 mode=755 type=dir\n        README          time=1231975636.0 uid=1002 size=8\n        config          time=1232266273.0 gid=1003 uid=1003 size=8\n    # ./subdir\n    ..\n\n\n# ./subdir2\n    subdir2         time=1233504586.0 mode=755 type=dir\n    # ./subdir2\n    ..\n\n\n# ./subdir3\n    subdir3         time=1233504586.0 mode=755 type=dir\n        mtree           nlink=2 time=1232266273.0 gid=1003 uid=1003 size=8\n    # ./subdir3\n    ..\n\n..\n\n"
    ;
    pcVar13 = "image";
    wVar3 = L'\x9d';
  }
  else {
    pcVar8 = 
    "#mtree\n# .\n/set type=dir uid=1001 gid=1001 mode=755\n.               time=1231975636.0\n# ./subdir\n    subdir          time=1233504586.0\n    # ./subdir\n    ..\n# ./subdir2\n    subdir2         time=1233504586.0\n    # ./subdir2\n    ..\n# ./subdir3\n    subdir3         time=1233504586.0\n    # ./subdir3\n    ..\n..\n"
    ;
    pcVar13 = "image_dironly";
    wVar3 = L'\x9b';
  }
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
             ,wVar3,buff,"buff",pcVar8,pcVar13,(void *)0x0,L'\0');
  paVar7 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                   ,L'¢',(uint)(paVar7 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar4 = archive_read_support_format_all(paVar7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                      ,L'£',0,"ARCHIVE_OK",(long)iVar4,"archive_read_support_format_all(a)",paVar7)
  ;
  iVar4 = archive_read_support_filter_all(paVar7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                      ,L'¤',0,"ARCHIVE_OK",(long)iVar4,"archive_read_support_filter_all(a)",paVar7)
  ;
  iVar4 = archive_read_open_memory(paVar7,buff,local_38);
  local_48 = paVar7;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                      ,L'¥',0,"ARCHIVE_OK",(long)iVar4,"archive_read_open_memory(a, buff, used)",
                      paVar7);
  pcVar8 = ".";
  lVar14 = 0;
  do {
    paVar7 = local_48;
    if ((local_4c == 0) || ((*(uint *)((long)&entries[0].mode + lVar14) & 0xf000) == 0x4000)) {
      iVar4 = archive_read_next_header(local_48,&local_58);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                          ,L'«',0,"ARCHIVE_OK",(long)iVar4,"archive_read_next_header(a, &ae)",
                          paVar7);
      lVar11 = *(longlong *)((long)&entries[0].mtime + lVar14);
      tVar10 = archive_entry_mtime(local_58);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                          ,L'¬',lVar11,"entries[i].mtime",tVar10,"archive_entry_mtime(ae)",
                          (void *)0x0);
      uVar1 = *(uint *)((long)&entries[0].mode + lVar14);
      mVar6 = archive_entry_mode(local_58);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                          ,L'­',(ulong)uVar1,"entries[i].mode",(ulong)mVar6,
                          "archive_entry_mode(ae)",(void *)0x0);
      uVar2 = *(uint *)((long)&entries[0].uid + lVar14);
      lVar9 = archive_entry_uid(local_58);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                          ,L'®',(ulong)uVar2,"entries[i].uid",lVar9,"archive_entry_uid(ae)",
                          (void *)0x0);
      uVar2 = *(uint *)((long)&entries[0].gid + lVar14);
      lVar9 = archive_entry_gid(local_58);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                          ,L'¯',(ulong)uVar2,"entries[i].gid",lVar9,"archive_entry_gid(ae)",
                          (void *)0x0);
      if (lVar14 == 0) {
        pcVar13 = archive_entry_pathname(local_58);
        wVar3 = L'µ';
        e1 = "entries[i].path";
      }
      else {
        pcVar8 = pcVar8 + 2;
        pcVar13 = archive_entry_pathname(local_58);
        wVar3 = L'²';
        e1 = "entries[i].path + 2";
      }
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                 ,wVar3,pcVar8,e1,pcVar13,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      if ((uVar1 & 0xf000) != 0x4000) {
        lVar9 = archive_entry_size(local_58);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                            ,L'·',8,"8",lVar9,"archive_entry_size(ae)",(void *)0x0);
      }
    }
    paVar7 = local_48;
    pcVar8 = *(char **)((long)&entries[1].path + lVar14);
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0x180);
  iVar4 = archive_read_close(local_48);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                      ,L'¹',0,"ARCHIVE_OK",(long)iVar4,"archive_read_close(a)",paVar7);
  iVar4 = archive_read_free(paVar7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_mtree_classic_indent.c"
                      ,L'º',0,"ARCHIVE_OK",(long)iVar4,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

static void
test_write_format_mtree_sub(int use_set, int dironly)
{
	struct archive_entry *ae;
	struct archive* a;
	size_t used;
	int i;

	/* Create a mtree format archive. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_mtree(a));
	if (use_set)
		assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_option(a, NULL, "use-set", "1"));
	if (dironly)
		assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_option(a, NULL, "dironly", "1"));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, sizeof(buff)-1, &used));

	/* Write entries */
	for (i = 0; entries[i].path != NULL; i++) {
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_set_mtime(ae, entries[i].mtime, 0);
		assert(entries[i].mtime == archive_entry_mtime(ae));
		archive_entry_set_mode(ae, entries[i].mode);
		assert(entries[i].mode == archive_entry_mode(ae));
		archive_entry_set_uid(ae, entries[i].uid);
		assert(entries[i].uid == archive_entry_uid(ae));
		archive_entry_set_gid(ae, entries[i].gid);
		assert(entries[i].gid == archive_entry_gid(ae));
		archive_entry_copy_pathname(ae, entries[i].path);
		if ((entries[i].mode & AE_IFMT) != S_IFDIR)
			archive_entry_set_size(ae, 8);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		if ((entries[i].mode & AE_IFMT) != S_IFDIR)
			assertEqualIntA(a, 8,
			    archive_write_data(a, "Hello012", 15));
		archive_entry_free(ae);
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
        assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	if (use_set) {
		const char *p;

		buff[used] = '\0';
		assert(NULL != (p = strstr(buff, "\n/set ")));
		if (p != NULL) {
			char *r;
			const char *o;
			p++;
			r = strchr(p, '\n');
			if (r != NULL)
				*r = '\0';
			if (dironly)
				o = "/set type=dir uid=1001 gid=1001 mode=755";
			else
				o = "/set type=file uid=1001 gid=1001 mode=644";
			assertEqualString(o, p);
			if (r != NULL)
				*r = '\n';
		}
	}

	/*
	 * Read the data and check it.
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used));

	/* Read entries */
	for (i = 0; entries[i].path != NULL; i++) {
		if (dironly && (entries[i].mode & AE_IFMT) != S_IFDIR)
			continue;
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
		assertEqualInt(entries[i].mtime, archive_entry_mtime(ae));
		assertEqualInt(entries[i].mode, archive_entry_mode(ae));
		assertEqualInt(entries[i].uid, archive_entry_uid(ae));
		assertEqualInt(entries[i].gid, archive_entry_gid(ae));
		assertEqualString(entries[i].path, archive_entry_pathname(ae));
		if ((entries[i].mode & AE_IFMT) != S_IFDIR)
			assertEqualInt(8, archive_entry_size(ae));
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}